

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainAppendTerm(StrAccum *pStr,Index *pIdx,int nTerm,int iTerm,int bAnd,char *zOp)

{
  char *z;
  int local_34;
  int i;
  char *zOp_local;
  int bAnd_local;
  int iTerm_local;
  int nTerm_local;
  Index *pIdx_local;
  StrAccum *pStr_local;
  
  if (bAnd != 0) {
    sqlite3_str_append(pStr," AND ",5);
  }
  if (1 < nTerm) {
    sqlite3_str_append(pStr,"(",1);
  }
  for (local_34 = 0; local_34 < nTerm; local_34 = local_34 + 1) {
    if (local_34 != 0) {
      sqlite3_str_append(pStr,",",1);
    }
    z = explainIndexColumnName(pIdx,iTerm + local_34);
    sqlite3_str_appendall(pStr,z);
  }
  if (1 < nTerm) {
    sqlite3_str_append(pStr,")",1);
  }
  sqlite3_str_append(pStr,zOp,1);
  if (1 < nTerm) {
    sqlite3_str_append(pStr,"(",1);
  }
  for (local_34 = 0; local_34 < nTerm; local_34 = local_34 + 1) {
    if (local_34 != 0) {
      sqlite3_str_append(pStr,",",1);
    }
    sqlite3_str_append(pStr,"?",1);
  }
  if (1 < nTerm) {
    sqlite3_str_append(pStr,")",1);
  }
  return;
}

Assistant:

static void explainAppendTerm(
  StrAccum *pStr,             /* The text expression being built */
  Index *pIdx,                /* Index to read column names from */
  int nTerm,                  /* Number of terms */
  int iTerm,                  /* Zero-based index of first term. */
  int bAnd,                   /* Non-zero to append " AND " */
  const char *zOp             /* Name of the operator */
){
  int i;

  assert( nTerm>=1 );
  if( bAnd ) sqlite3_str_append(pStr, " AND ", 5);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_appendall(pStr, explainIndexColumnName(pIdx, iTerm+i));
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);

  sqlite3_str_append(pStr, zOp, 1);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_append(pStr, "?", 1);
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);
}